

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap_storage.cpp
# Opt level: O0

int __thiscall
libtorrent::aux::mmap_storage::hash
          (mmap_storage *this,settings_interface *sett,hasher *ph,ptrdiff_t len,piece_index_t piece,
          int offset,open_mode_t mode,disk_job_flags_t flags,storage_error *error)

{
  anon_class_40_6_d077f2ea op;
  int iVar1;
  file_storage *files;
  undefined4 uStack_9c;
  span<const_char> local_78 [2];
  undefined1 local_58 [8];
  vector<char,_std::allocator<char>_> scratch;
  char dummy;
  int offset_local;
  ptrdiff_t len_local;
  hasher *ph_local;
  settings_interface *sett_local;
  mmap_storage *this_local;
  disk_job_flags_t flags_local;
  open_mode_t mode_local;
  piece_index_t piece_local;
  
  scratch.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = offset;
  ::std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_58);
  files = mmap_storage::files(this);
  span<const_char>::span
            (local_78,&scratch.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x13,
             len);
  uStack_9c = CONCAT31(uStack_9c._1_3_,flags.m_val);
  op._12_4_ = uStack_9c;
  op.mode.m_val = mode.m_val;
  op.this = this;
  op.ph = ph;
  op.sett = sett;
  op.scratch = (vector<char,_std::allocator<char>_> *)local_58;
  iVar1 = readwrite<libtorrent::aux::mmap_storage::hash(libtorrent::settings_interface_const&,libtorrent::lcrypto::hasher&,long,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,int,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::aux::open_mode_tag,void>,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::disk_job_flags_tag,void>,libtorrent::storage_error&)::__0>
                    (files,local_78[0],piece,
                     scratch.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_,error,op
                    );
  ::std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)local_58);
  return iVar1;
}

Assistant:

int mmap_storage::hash(settings_interface const& sett
		, hasher& ph, std::ptrdiff_t const len
		, piece_index_t const piece, int const offset
		, aux::open_mode_t const mode
		, disk_job_flags_t const flags
		, storage_error& error)
	{
#ifdef TORRENT_SIMULATE_SLOW_READ
		std::this_thread::sleep_for(milliseconds(rand() % 2000));
#endif

		char dummy;
		std::vector<char> scratch;

		return readwrite(files(), span<char const>{&dummy, len}, piece, offset, error
			, [this, mode, flags, &ph, &sett, &scratch](file_index_t const file_index
				, std::int64_t const file_offset
				, span<char const> const buf, storage_error& ec)
		{
			if (files().pad_file_at(file_index))
				return aux::hash_zeroes(ph, buf.size());

			if (file_index < m_file_priority.end_index()
				&& m_file_priority[file_index] == dont_download
				&& use_partfile(file_index))
			{
				error_code e;
				peer_request map = files().map_file(file_index, file_offset, 0);
				int const ret = m_part_file->hash(ph, buf.size()
					, map.piece, map.start, e);

				if (e)
				{
					ec.ec = e;
					ec.operation = operation_t::partfile_read;
					return -1;
				}
				return ret;
			}

			auto handle = open_file(sett, file_index, mode, ec);
			if (ec) return -1;

			if (!handle->has_memory_map())
			{
				scratch.resize(std::size_t(buf.size()));
				int const ret = aux::pread_all(handle->fd(), scratch, file_offset, ec.ec);
				if (ec) return -1;
				ph.update(scratch);
				return ret;
			}

			int ret = 0;
			span<byte const> file_range = handle->range();
			if (file_range.size() > file_offset)
			{
				file_range = file_range.subspan(std::ptrdiff_t(file_offset)
					, std::min(buf.size(), std::ptrdiff_t(file_range.size() - file_offset)));

				sig::try_signal([&]{
					ph.update({const_cast<char const*>(file_range.data()), file_range.size()});
				});
				ret += static_cast<int>(file_range.size());
				if (flags & disk_interface::volatile_read)
					handle->dont_need(file_range);
				if (flags & disk_interface::flush_piece)
					handle->page_out(file_range);
			}

			return ret;
		});
	}